

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::TextureCubeArrayFormatCase::testLayerFace
          (TextureCubeArrayFormatCase *this,int layerFaceNdx)

{
  TestLog *log;
  RenderContext *context;
  TextureFormat name;
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  RGBA threshold;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CubeFace face;
  int layerFaceNdx_local;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  PixelBufferAccess local_1c0;
  Surface referenceFrame;
  Surface renderedFrame;
  string local_168;
  undefined1 local_148 [32];
  string local_128;
  ReferenceParams local_104;
  TextureFormatInfo spec;
  long lVar5;
  
  layerFaceNdx_local = layerFaceNdx;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = this->m_size;
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),iVar2,iVar2,dVar4);
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  local_104.super_RenderParams.texType =
       (TextureType)
       tcu::PixelFormat::getColorThreshold((PixelFormat *)(CONCAT44(extraout_var_01,iVar2) + 8));
  spec.valueMin.m_data[0] = 2.3694278e-38;
  threshold = tcu::operator+((RGBA *)&local_104,(RGBA *)&spec);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_104,TEXTURETYPE_CUBE_ARRAY);
  tcu::getTextureFormatInfo(&spec,(TextureFormat *)&this->m_texture->m_refTexture);
  face = CUBEFACE_LAST;
  if ((uint)((long)layerFaceNdx % 6) < 6) {
    face = *(CubeFace *)(&DAT_018afd2c + ((long)layerFaceNdx % 6 & 0xffffffffU) * 4);
  }
  local_104.super_RenderParams.samplerType =
       glu::TextureTestUtil::getSamplerType
                 ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_format);
  local_104.sampler.magFilter = NEAREST;
  local_104.sampler.lodThreshold = 0.0;
  local_104.sampler.wrapS = CLAMP_TO_EDGE;
  local_104.sampler.wrapT = CLAMP_TO_EDGE;
  local_104.sampler.wrapR = CLAMP_TO_EDGE;
  local_104.sampler.minFilter = NEAREST;
  local_104.sampler.normalizedCoords = true;
  local_104.sampler.borderColor.v._8_8_ = 0;
  local_104.sampler.compare = COMPAREMODE_NONE;
  local_104.sampler.compareChannel = 0;
  local_104.sampler.borderColor.v._0_8_ = 0;
  local_104.sampler.seamlessCubeMap = true;
  local_104.sampler._53_3_ = 0;
  local_104.sampler.depthStencilMode = MODE_DEPTH;
  local_104.super_RenderParams.colorScale.m_data[0] = spec.lookupScale.m_data[0];
  local_104.super_RenderParams.colorScale.m_data[1] = spec.lookupScale.m_data[1];
  local_104.super_RenderParams.colorScale.m_data[2] = spec.lookupScale.m_data[2];
  local_104.super_RenderParams.colorScale.m_data[3] = spec.lookupScale.m_data[3];
  local_104.super_RenderParams.colorBias.m_data[0] = spec.lookupBias.m_data[0];
  local_104.super_RenderParams.colorBias.m_data[1] = spec.lookupBias.m_data[1];
  local_104.super_RenderParams.colorBias.m_data[2] = spec.lookupBias.m_data[2];
  local_104.super_RenderParams.colorBias.m_data[3] = spec.lookupBias.m_data[3];
  local_1c0.super_ConstPixelBufferAccess.m_format.order = R;
  local_1c0.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_148._0_4_ = (undefined4)(layerFaceNdx / 6);
  local_168._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_148._4_4_ = local_148._0_4_;
  glu::TextureTestUtil::computeQuadTexCoordCubeArray
            (&texCoord,face,(Vec2 *)&local_1c0,(Vec2 *)&local_168,(Vec2 *)local_148);
  (**(code **)(lVar5 + 0x188))(0x4500);
  (**(code **)(lVar5 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  glu::TextureCubeArray::upload(this->m_texture);
  (**(code **)(lVar5 + 8))(0x84c0);
  (**(code **)(lVar5 + 0xb8))(0x9009,this->m_texture->m_glTexture);
  (**(code **)(lVar5 + 0x1360))(0x9009,0x2802,0x812f);
  (**(code **)(lVar5 + 0x1360))(0x9009,0x2803,0x812f);
  (**(code **)(lVar5 + 0x1360))(0x9009,0x2801,0x2600);
  (**(code **)(lVar5 + 0x1360))(0x9009,0x2800,0x2600);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFormatTests.cpp"
                  ,0xd7);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_104.super_RenderParams);
  context = this->m_renderCtx;
  tcu::Surface::getAccess(&local_1c0,&renderedFrame);
  glu::readPixels(context,viewport.x,viewport.y,&local_1c0);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)&local_1c0,&referenceFrame,
             (PixelFormat *)(CONCAT44(extraout_var_02,iVar2) + 8));
  local_168._M_string_length = (size_type)(this->m_texture->m_refTexture).m_view.m_levels;
  local_168._M_dataplus._M_p._0_4_ = (this->m_texture->m_refTexture).m_view.m_numLevels;
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)&local_1c0,(TextureCubeArrayView *)&local_168,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_104);
  de::toString<int>(&local_168,&layerFaceNdx_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0,
                 "LayerFace",&local_168);
  name = local_1c0.super_ConstPixelBufferAccess.m_format;
  de::toString<int>(&local_128,&layerFaceNdx_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 "Layer-face ",&local_128);
  bVar1 = glu::TextureTestUtil::compareImages
                    (log,(char *)name,(char *)CONCAT44(local_148._4_4_,local_148._0_4_),
                     &referenceFrame,&renderedFrame,threshold);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_168);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  return bVar1;
}

Assistant:

bool TextureCubeArrayFormatCase::testLayerFace (int layerFaceNdx)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	TestLog&				log				= m_testCtx.getLog();
	RandomViewport			viewport		(m_renderCtx.getRenderTarget(), m_size, m_size, deStringHash(getName()));
	tcu::Surface			renderedFrame	(viewport.width, viewport.height);
	tcu::Surface			referenceFrame	(viewport.width, viewport.height);
	tcu::RGBA				threshold		= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;
	ReferenceParams			renderParams	(TEXTURETYPE_CUBE_ARRAY);
	tcu::TextureFormatInfo	spec			= tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());
	const int				layerNdx		= layerFaceNdx / 6;
	const tcu::CubeFace		face			= getCubeFaceFromNdx(layerFaceNdx % 6);

	renderParams.samplerType				= getSamplerType(m_texture->getRefTexture().getFormat());
	renderParams.sampler					= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.sampler.seamlessCubeMap	= true;
	renderParams.colorScale					= spec.lookupScale;
	renderParams.colorBias					= spec.lookupBias;

	// Layer here specifies the cube slice
	computeQuadTexCoordCubeArray(texCoord, face, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f), tcu::Vec2((float)layerNdx));

	// Setup base viewport.
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Upload texture data to GL.
	m_texture->upload();

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], renderParams);

	// Compare and log.
	return compareImages(log, (string("LayerFace" + de::toString(layerFaceNdx))).c_str(), (string("Layer-face " + de::toString(layerFaceNdx))).c_str(), referenceFrame, renderedFrame, threshold);
}